

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::GlobalImport::~GlobalImport(GlobalImport *this)

{
  (this->super_ImportMixin<(wabt::ExternalKind)3>).super_Import._vptr_Import =
       (_func_int **)&PTR__GlobalImport_00196b90;
  Global::~Global(&this->global);
  Import::~Import((Import *)this);
  return;
}

Assistant:

explicit GlobalImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Global>(), global(name) {}